

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::opt::anon_unknown_0::ExtractInts
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,uint64_t val)

{
  value_type local_24;
  value_type local_20;
  undefined1 local_19;
  uint64_t local_18;
  uint64_t val_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  
  local_19 = 0;
  local_18 = val;
  val_local = (uint64_t)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  local_20 = (value_type)local_18;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (__return_storage_ptr__,&local_20);
  local_24 = (value_type)(local_18 >> 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (__return_storage_ptr__,&local_24);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> ExtractInts(uint64_t val) {
  std::vector<uint32_t> words;
  words.push_back(static_cast<uint32_t>(val));
  words.push_back(static_cast<uint32_t>(val >> 32));
  return words;
}